

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrdopt.c
# Opt level: O2

void read_Xoption(int *argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  int *piVar9;
  int iVar10;
  int extraout_EDX;
  ulong uVar11;
  long lVar12;
  XrmValue value;
  XrmDatabase rDB;
  XrmDatabase commandlineDB;
  int *local_530;
  char *str_type [30];
  char tmp [1024];
  
  commandlineDB = (XrmDatabase)0x0;
  rDB = (XrmDatabase)0x0;
  iVar4 = *argc;
  local_530 = argc;
  for (lVar12 = 1; lVar12 < iVar4; lVar12 = lVar12 + 1) {
    pcVar8 = argv[lVar12];
    if (pcVar8 != (char *)0x0) {
      iVar3 = 0x13a1b2;
      iVar2 = strcmp(pcVar8,"-help");
      if (iVar2 == 0) goto LAB_00138ec8;
      iVar3 = 0x13a1b8;
      iVar2 = strcmp(pcVar8,"-HELP");
      if (iVar2 == 0) goto LAB_00138ec8;
    }
  }
  XrmInitialize();
  XrmParseCommand(&commandlineDB,opTable,0x21,"ldex",local_530,argv);
  iVar3 = 0x140c1d;
  iVar2 = XrmGetResource(commandlineDB,"ldex.help","Ldex.Help",str_type,&value);
  if (iVar2 == 1) {
LAB_00138ec8:
    pcVar8 = *argv;
    print_Xusage(pcVar8);
    iVar2 = *(int *)(pcVar8 + 0xa0) - *(int *)(pcVar8 + 0x148);
    if (iVar3 < iVar2) {
      iVar2 = iVar3;
    }
    if (iVar3 < 1) {
      iVar2 = 0;
    }
    iVar3 = *(int *)(pcVar8 + 0xa4);
    *(int *)(pcVar8 + 0x140) = iVar2;
    iVar1 = *(int *)(pcVar8 + 0x14c);
    iVar10 = iVar3 - iVar1;
    if (extraout_EDX < iVar10) {
      iVar10 = extraout_EDX;
    }
    if (extraout_EDX < 1) {
      iVar10 = 0;
    }
    *(int *)(pcVar8 + 0x144) = iVar10;
    uVar11 = (long)(iVar2 * *(int *)(pcVar8 + 0x148)) / (long)*(int *)(pcVar8 + 0xa0) & 0xffffffff;
    XMoveWindow(*(undefined8 *)(pcVar8 + 0xe0),*(undefined8 *)(pcVar8 + 0x108),uVar11,
                -*(int *)(pcVar8 + 0x150),uVar11,iVar1,argv,lVar12,(long)iVar4);
    XMoveWindow(*(undefined8 *)(pcVar8 + 0xe0),*(undefined8 *)(pcVar8 + 0x110),
                -*(int *)(pcVar8 + 0x150),(long)(iVar10 * iVar1) / (long)iVar3 & 0xffffffff);
    (**(code **)(pcVar8 + 0x70))
              (pcVar8,0,*(undefined4 *)(pcVar8 + 0x140),*(undefined4 *)(pcVar8 + 0x144),
               *(undefined4 *)(pcVar8 + 0x148),*(undefined4 *)(pcVar8 + 0x14c));
    return;
  }
  iVar3 = XrmGetResource(commandlineDB,"ldex.sysout","Ldex.Sysout",str_type,&value);
  if (iVar3 == 1) {
    strncpy(sysout_name_cl,value.addr,(ulong)value.size);
  }
  iVar3 = XrmGetResource(commandlineDB,"ldex.display","Ldex.Display",str_type,&value);
  if (iVar3 == 1) {
    strncpy(Display_Name,value.addr,(ulong)value.size);
  }
  else {
    pcVar8 = getenv("DISPLAY");
    if (pcVar8 == (char *)0x0) {
      lVar12 = 0x2b;
      fwrite("Can\'t find a display. Either set the shell\n",0x2b,1,_stderr);
      fwrite("variable DISPLAY to an appropriate display\n",0x2b,1,_stderr);
      iVar3 = 0x20;
      fwrite("or provide a -display argument.\n",0x20,1,_stderr);
      goto LAB_00138ec8;
    }
    strcpy(Display_Name,pcVar8);
  }
  lVar12 = XOpenDisplay(Display_Name);
  __stream = _stderr;
  if (lVar12 == 0) {
    uVar7 = XDisplayName(Display_Name);
    fprintf(__stream,"Open_Display: cannot connect to display %s.",uVar7);
    exit(-1);
  }
  builtin_strncpy(tmp + 0x10,"-defaults/",0xb);
  builtin_strncpy(tmp,"/usr/lib/X11/app",0x10);
  sVar5 = strlen(tmp);
  builtin_strncpy(tmp + sVar5,"medley",7);
  lVar6 = XrmGetFileDatabase(tmp);
  if (lVar6 != 0) {
    XrmMergeDatabases(lVar6,&rDB);
  }
  lVar6 = XResourceManagerString(lVar12);
  if (lVar6 != 0) {
    uVar7 = XResourceManagerString(lVar12);
    lVar6 = XrmGetStringDatabase(uVar7);
    if (lVar6 != 0) {
      XrmMergeDatabases(lVar6,&rDB);
    }
  }
  XCloseDisplay(lVar12);
  pcVar8 = getenv("HOME");
  strcat(tmp,pcVar8);
  sVar5 = strlen(tmp);
  builtin_strncpy(tmp + sVar5,"/.Xdefaults",0xc);
  iVar4 = access(tmp,4);
  if ((iVar4 != 0) && (lVar12 = XrmGetFileDatabase(tmp), lVar12 != 0)) {
    XrmMergeDatabases(lVar12,&rDB);
  }
  XrmMergeDatabases(commandlineDB,&rDB);
  iVar4 = XrmGetResource(rDB,"ldex.sysout","Ldex.Sysout",str_type,&value);
  if (iVar4 == 1) {
    strncpy(sysout_name_xrm,value.addr,(ulong)value.size);
  }
  iVar4 = XrmGetResource(rDB,"ldex.title","Ldex.Title",str_type,&value);
  pcVar8 = value.addr;
  if (iVar4 != 1) {
    pcVar8 = "Medley Interlisp";
  }
  strncpy(windowTitle,pcVar8,0xfe);
  iVar4 = XrmGetResource(rDB,"ldex.icontitle","Ldex.icontitle",str_type,&value);
  if (iVar4 == 1) {
    strncpy(iconTitle,value.addr,(ulong)value.size);
  }
  else {
    builtin_strncpy(iconTitle,"Medley",7);
  }
  iVar4 = XrmGetResource(rDB,"ldex.iconbitmap","Ldex.Iconbitmap",str_type,&value);
  if (iVar4 == 1) {
    strncpy(iconpixmapfile,value.addr,(ulong)value.size);
  }
  iVar4 = XrmGetResource(rDB,"ldex.geometry","Ldex.geometry",str_type,&value);
  if (iVar4 == 1) {
    strncpy(tmp,value.addr,(ulong)value.size);
    XParseGeometry(tmp,&LispWindowRequestedX,&LispWindowRequestedY,&LispWindowRequestedWidth,
                   &LispWindowRequestedHeight);
  }
  iVar4 = XrmGetResource(rDB,"ldex.screen","Ldex.screen",str_type,&value);
  if (iVar4 == 1) {
    strncpy(tmp,value.addr,(ulong)value.size);
    XParseGeometry(tmp,&LispDisplayRequestedX,&LispDisplayRequestedY,&LispDisplayRequestedWidth,
                   &LispDisplayRequestedHeight);
  }
  tmp._0_8_ = tmp._0_8_ & 0xffffffffffffff00;
  iVar4 = XrmGetResource(rDB,"ldex.cursorColor","Ldex.cursorColor",str_type,&value);
  if (iVar4 == 1) {
    strncpy(cursorColor,value.addr,0xfe);
  }
  iVar4 = XrmGetResource(rDB,"ldex.foreground","Ldex.foreground",str_type,&value);
  if (iVar4 == 1) {
    strncpy(foregroundColorName,value.addr,0x3f);
  }
  iVar4 = XrmGetResource(rDB,"ldex.background","Ldex.background",str_type,&value);
  if (iVar4 == 1) {
    strncpy(backgroundColorName,value.addr,0x3f);
  }
  iVar4 = XrmGetResource(rDB,"ldex.NoFork","Ldex.NoFork",str_type,&value);
  if (iVar4 == 1) {
    please_fork = 0;
  }
  iVar4 = XrmGetResource(rDB,"ldex.noscroll","Ldex.noscroll",str_type,&value);
  if (iVar4 == 1) {
    noscroll = 1;
  }
  iVar4 = XrmGetResource(rDB,"ldex.timer","Ldex.timer",str_type,&value);
  if (iVar4 == 1) {
    strncpy(tmp,value.addr,(ulong)value.size);
    piVar9 = __errno_location();
    *piVar9 = 0;
    lVar12 = strtol(tmp,(char **)0x0,10);
    if (0 < (int)lVar12 && *piVar9 == 0) {
      TIMER_INTERVAL = (int)lVar12;
    }
  }
  iVar4 = XrmGetResource(rDB,"ldex.memory","Ldex.memory",str_type,&value);
  if (iVar4 == 1) {
    strncpy(tmp,value.addr,(ulong)value.size);
    piVar9 = __errno_location();
    *piVar9 = 0;
    lVar12 = strtol(tmp,(char **)0x0,10);
    if (0 < (int)(uint)lVar12 && *piVar9 == 0) {
      sysout_size = (uint)lVar12;
    }
  }
  iVar4 = XrmGetResource(rDB,"ldex.Init","Ldex.Init",str_type,&value);
  if (iVar4 == 1) {
    for_makeinit = 1;
  }
  iVar4 = XrmGetResource(rDB,"ldex.xsync","Ldex.xsync",str_type,&value);
  if (iVar4 == 1) {
    xsync = 1;
  }
  return;
}

Assistant:

void read_Xoption(int *argc, char *argv[])
{
  int bitmask;
  XrmDatabase commandlineDB = NULL, applicationDB, serverDB, rDB = NULL;
  XrmValue value;
  char *str_type[30], tmp[1024], *envname;
  Display *xdisplay;
  int i;

  /**********************************************/
  /*                                            */
  /*  Take care of -help flag, which            */
  /*  isn't handled correctly by the X code.    */
  /*                                            */
  /**********************************************/

  for (i = 1; i < *argc; i++) {
    if (argv[i] && ((strcmp(argv[i], "-help") == 0) || (strcmp(argv[i], "-HELP") == 0))) {
      print_Xusage(argv[0]);
      exit(0);
    }
  }

  /* Now let X handle the parsing. */

  (void)XrmInitialize();
/* If the first argv lacks '-' in front it is the sysout. */
#ifdef NEVEFR
  /* JDS 12/20/01: app name should always be "ldex", not what's in argv?? */
  XrmParseCommand(&commandlineDB, opTable, opTableEntries, argv[0], argc, argv);
#endif
  XrmParseCommand(&commandlineDB, opTable, sizeof(opTable) / sizeof(opTable[0]), "ldex", argc, argv);

  if (XrmGetResource(commandlineDB, "ldex.help", "Ldex.Help", str_type, &value) == True) {
    print_Xusage(argv[0]);
  }

  if (XrmGetResource(commandlineDB, "ldex.sysout", "Ldex.Sysout", str_type, &value) == True) {
    /* Get Sysout from command line only */
    (void)strncpy(sysout_name_cl, value.addr, value.size);
  }

  /* In order to access other DB's we have to open the main display now */
  /* This is just temporary. We'll need this display struct to open the */
  /* main databases for medley. After it is used the display will be */
  /* closed and the opening of the other displays will follow the standard */
  /* protocol. */

  if (XrmGetResource(commandlineDB, "ldex.display", "Ldex.Display", str_type, &value) == True) {
    (void)strncpy(Display_Name, value.addr, value.size);
  } else if (getenv("DISPLAY") == (char *)NULL) {
    (void)fprintf(stderr, "Can't find a display. Either set the shell\n");
    (void)fprintf(stderr, "variable DISPLAY to an appropriate display\n");
    (void)fprintf(stderr, "or provide a -display argument.\n");
    print_Xusage(argv[0]);
  } else {
    envname = getenv("DISPLAY");
    (void)strcpy(Display_Name, envname);
  }
  if ((xdisplay = XOpenDisplay(Display_Name)) != NULL) {
    /* read the other databases */
    /* Start with app-defaults/medley */
    (void)strcpy(tmp, "/usr/lib/X11/app-defaults/");
    (void)strcat(tmp, "medley");
    applicationDB = XrmGetFileDatabase(tmp);
    if (applicationDB != NULL) { (void)XrmMergeDatabases(applicationDB, &rDB); }
    /* Then try the displays defaults */
    if (XResourceManagerString(xdisplay) != NULL) {
      serverDB = XrmGetStringDatabase(XResourceManagerString(xdisplay));
      if (serverDB != NULL) { (void)XrmMergeDatabases(serverDB, &rDB); }
    }
    XCloseDisplay(xdisplay);
  } else {
    (void)fprintf(stderr, "Open_Display: cannot connect to display %s.", XDisplayName(Display_Name));
    exit(-1);
  }

  envname = getenv("HOME");
  (void)strcat(tmp, envname);
  (void)strcat(tmp, "/.Xdefaults");
  if (access(tmp, R_OK) != 0) {
    serverDB = XrmGetFileDatabase(tmp);
    if (serverDB != NULL) { (void)XrmMergeDatabases(serverDB, &rDB); }
  }

  /* Now for the commandline */
  (void)XrmMergeDatabases(commandlineDB, &rDB);

  if (XrmGetResource(rDB, "ldex.sysout", "Ldex.Sysout", str_type, &value) == True) {
    /* Get Sysout from x resource manager */
    (void)strncpy(sysout_name_xrm, value.addr, value.size);
  }

  if (XrmGetResource(rDB, "ldex.title", "Ldex.Title", str_type, &value) == True) {
    (void)strncpy(windowTitle, value.addr, sizeof(windowTitle) - 1);
  } else {
    (void)strncpy(windowTitle, WINDOW_NAME, sizeof(windowTitle) - 1);
  }
  if (XrmGetResource(rDB, "ldex.icontitle", "Ldex.icontitle", str_type, &value) == True) {
    (void)strncpy(iconTitle, value.addr, value.size);
  } else {
    (void)strcpy(iconTitle, "Medley");
  }

  if (XrmGetResource(rDB, "ldex.iconbitmap", "Ldex.Iconbitmap", str_type, &value) == True) {
    (void)strncpy(iconpixmapfile, value.addr, value.size);
  }

  /* Old style geometry definition. */
  if (XrmGetResource(rDB, "ldex.geometry", "Ldex.geometry", str_type, &value) == True) {
    /* Get Geometry */
    (void)strncpy(tmp, value.addr, value.size);
    bitmask = XParseGeometry(tmp, &LispWindowRequestedX, &LispWindowRequestedY,
                             &LispWindowRequestedWidth, &LispWindowRequestedHeight);
  }
  if (XrmGetResource(rDB, "ldex.screen", "Ldex.screen", str_type, &value) == True) {
    /* Get Geometry */
    (void)strncpy(tmp, value.addr, value.size);
    bitmask = XParseGeometry(tmp, &LispDisplayRequestedX, &LispDisplayRequestedY,
                             &LispDisplayRequestedWidth, &LispDisplayRequestedHeight);
  }

  (void)strcpy(tmp, ""); /* Clear the string */

  if (XrmGetResource(rDB, "ldex.cursorColor", "Ldex.cursorColor", str_type, &value) == True) {
    (void)strncpy(cursorColor, value.addr, sizeof(cursorColor) - 1);
  }

  if (XrmGetResource(rDB, "ldex.foreground", "Ldex.foreground", str_type, &value) == True) {
    (void)strncpy(foregroundColorName, value.addr, sizeof(foregroundColorName) - 1);
  }

  if (XrmGetResource(rDB, "ldex.background", "Ldex.background", str_type, &value) == True) {
    (void)strncpy(backgroundColorName, value.addr, sizeof(backgroundColorName) - 1);
  }

  if (XrmGetResource(rDB, "ldex.NoFork", "Ldex.NoFork", str_type, &value) == True) {
    please_fork = 0;
  }

  if (XrmGetResource(rDB, "ldex.noscroll", "Ldex.noscroll", str_type, &value) == True) {
    noscroll = 1;
  }

  if (XrmGetResource(rDB, "ldex.timer", "Ldex.timer", str_type, &value) == True) {
    (void)strncpy(tmp, value.addr, value.size);
    errno = 0;
    i = (int)strtol(tmp, (char **)NULL, 10);
    if (errno == 0 && i > 0)
      TIMER_INTERVAL = i;
  }

  /*    if (XrmGetResource(rDB,
                         "ldex.maxpages",
                         "Ldex.maxpages",
                         str_type, &value) == True) {
        (void)strncpy(tmp, value.addr, value.size);
        maxpages = (unsigned)strtol((tmp, (char **)NULL, 10);
	// should check no error here 
      }
  */
  if (XrmGetResource(rDB, "ldex.memory", "Ldex.memory", str_type, &value) == True) {
    (void)strncpy(tmp, value.addr, value.size);
    errno = 0;
    i = (int)strtol(tmp, (char **)NULL, 10);
    if (errno == 0 && i > 0)
      sysout_size = (unsigned)i;
  }

  if (XrmGetResource(rDB, "ldex.Init", "Ldex.Init", str_type, &value) == True) { for_makeinit = 1; }

  if (XrmGetResource(rDB, "ldex.xsync", "Ldex.xsync", str_type, &value) == True) { xsync = True; }
#ifdef MAIKO_ENABLE_ETHERNET
  if (XrmGetResource(rDB, "ldex.EtherNet", "Ldex.EtherNet", str_type, &value) == True) {
    int b0, b1, b2, b3, b4, b5;
    (void)strncpy(tmp, value.addr, value.size);
#if defined(USE_DLPI)
    if (sscanf(tmp, "%d:%x:%x:%x:%x:%x:%x", &ether_fd, &b0, &b1, &b2, &b3, &b4, &b5) == 7)
#elif defined(USE_NIT)
    if (sscanf(tmp, "%d:%x:%x:%x:%x:%x:%x:%s", &ether_fd, &b0, &b1, &b2, &b3, &b4, &b5,
               snit.snit_ifname) == 8)
#endif /* USE_NIT */
    {
      ether_host[0] = b0;
      ether_host[1] = b1;
      ether_host[2] = b2;
      ether_host[3] = b3;
      ether_host[4] = b4;
      ether_host[5] = b5;
    } else {
      (void)fprintf(stderr, "Missing or bogus -E argument\n");
      ether_fd = -1;
      exit(1);
    }
  }
#endif /* MAIKO_ENABLE_ETHERNET */
}